

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *this_00;
  reference ppEVar2;
  string local_c8;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_a8;
  EnumVal *local_a0;
  EnumVal *ev;
  string local_90;
  EnumVal *local_70;
  EnumVal *enum_val;
  byte local_52;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string constant;
  EnumDef *enum_def;
  Value *value;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  if ((field->value).type.enum_def == (EnumDef *)0x0) {
    __assert_fail("value.type.enum_def",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                  ,0x71a,
                  "std::string flatbuffers::swift::SwiftGenerator::GenEnumDefaultValue(const FieldDef &)"
                 );
  }
  constant.field_2._8_8_ = (field->value).type.enum_def;
  bVar1 = IsVector(&(field->value).type);
  local_52 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"0",&local_51);
  }
  else {
    std::__cxx11::string::string((string *)local_50,(string *)&(field->value).constant);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  local_70 = EnumDef::FindByValue((EnumDef *)constant.field_2._8_8_,(string *)local_50);
  if (local_70 == (EnumVal *)0x0) {
    this_00 = EnumDef::Vals((EnumDef *)constant.field_2._8_8_);
    local_a8._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                   (this_00);
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_a8);
    local_a0 = *ppEVar2;
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_c8,&this->namer_,local_a0);
    std::operator+(__return_storage_ptr__,".",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_90,&this->namer_,local_70);
    std::operator+(__return_storage_ptr__,".",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  ev._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) {
    const auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    const auto &enum_def = *value.type.enum_def;
    // Vector of enum defaults are always "[]" which never works.
    const std::string constant = IsVector(value.type) ? "0" : value.constant;
    const auto enum_val = enum_def.FindByValue(constant);
    if (enum_val) {
      return "." + namer_.LegacySwiftVariant(*enum_val);
    } else {
      const auto &ev = **enum_def.Vals().begin();
      return "." + namer_.LegacySwiftVariant(ev);
    }
  }